

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectationTypes
          (ScriptValidator *this,Location *loc,TypeVector *result_types,Expectation *expect,
          char *desc)

{
  pointer pCVar1;
  ConstVector *expected;
  long lVar2;
  pointer pCVar3;
  size_t *psVar4;
  ConstVector *pCVar5;
  pointer pCVar6;
  byte bVar7;
  size_t local_80 [10];
  
  bVar7 = 0;
  if (expect->type_ == Either) {
    pCVar6 = (expect->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (expect->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar6 != pCVar1) {
      do {
        pCVar3 = pCVar6;
        psVar4 = local_80;
        for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
          *psVar4 = (pCVar3->loc).filename._M_len;
          pCVar3 = (pointer)((long)pCVar3 + (ulong)bVar7 * -0x10 + 8);
          psVar4 = psVar4 + (ulong)bVar7 * -2 + 1;
        }
        expected = (ConstVector *)operator_new(0x50);
        psVar4 = local_80;
        pCVar5 = expected;
        for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pCVar5->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)*psVar4;
          psVar4 = psVar4 + (ulong)bVar7 * -2 + 1;
          pCVar5 = (ConstVector *)((long)pCVar5 + ((ulong)bVar7 * -2 + 1) * 8);
        }
        CheckExpectation(this,loc,result_types,expected,
                         (char *)&expected[3].
                                  super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
        operator_delete(expected,0x50);
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != pCVar1);
    }
  }
  else if (expect->type_ == Values) {
    CheckExpectation(this,loc,result_types,
                     (ConstVector *)
                     (expect->expected).
                     super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (char *)(expect->expected).
                             super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
                             super__Vector_impl_data._M_finish);
    return;
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}